

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_widget.h
# Opt level: O1

void __thiscall nesvis::MemoryWidget::MemoryWidget(MemoryWidget *this,Nes *nes)

{
  long lVar1;
  long *plVar2;
  initializer_list<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  allocator_type local_1aa;
  less<unsigned_short> local_1a9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1a0;
  undefined1 local_198 [8];
  _Alloc_hider local_190;
  char local_180 [16];
  undefined2 local_170;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined2 local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined2 local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined2 local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined2 local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined2 local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined2 local_80;
  long *local_78 [2];
  long local_68 [2];
  undefined2 local_58;
  long *local_50 [2];
  long local_40 [2];
  
  this->nes_ = nes;
  local_1a8 = &(this->goto_address_input_).field_2;
  (this->goto_address_input_)._M_dataplus._M_p = (pointer)local_1a8;
  (this->goto_address_input_)._M_string_length = 0;
  (this->goto_address_input_).field_2._M_local_buf[0] = '\0';
  (this->goto_address_).super__Optional_base<unsigned_short,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_short>._M_engaged = false;
  local_198._0_2_ = 0;
  local_190._M_p = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Ram","");
  local_170 = 0x800;
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"Mirror of 0x0000-0x07FF","");
  local_148 = 0x1000;
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Mirror of 0x0000-0x07FF","");
  local_120 = 0x1800;
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Mirror of 0x0000-0x07FF","");
  local_f8 = 0x2000;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"PPU Registers","");
  local_d0 = 0x2008;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Mirror of 0x2000-0x2007","");
  local_a8 = 0x4000;
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Apu and I/O register","");
  local_80 = 0x4020;
  plVar2 = local_68;
  local_78[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Cartridge space","");
  local_1a0 = &this->cpu_mem_labels_;
  __l._M_len = 8;
  __l._M_array = (iterator)local_198;
  std::
  map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(local_1a0,__l,&local_1a9,&local_1aa);
  lVar1 = -0x140;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -5;
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0);
  local_198._0_2_ = 0;
  local_190._M_p = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Pattern table 0","");
  local_170 = 0x1000;
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"Pattern table 1","");
  local_148 = 0x2000;
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Nametable 0","");
  local_120 = 0x2400;
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Nametable 1","");
  local_f8 = 0x2800;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"Nametable 2","");
  local_d0 = 0x2c00;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Nametable 3","");
  local_a8 = 0x3000;
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Mirror of 0x2000-0x2EFF","");
  local_80 = 0x3f00;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Palette","");
  local_58 = 0x3f20;
  plVar2 = local_40;
  local_50[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Mirror of 0x3F00-0x3F1F","");
  __l_00._M_len = 9;
  __l_00._M_array = (iterator)local_198;
  std::
  map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->ppu_mem_lables_,__l_00,&local_1a9,&local_1aa);
  lVar1 = -0x168;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -5;
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0);
  return;
}

Assistant:

explicit MemoryWidget(n_e_s::nes::Nes *nes) : nes_(nes) {}